

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O1

void ImGui_ImplOpenGL3_RenderDrawData(ImDrawData *draw_data)

{
  undefined8 uVar1;
  ImDrawList *pIVar2;
  ImDrawCmd *pIVar3;
  code *pcVar4;
  undefined1 auVar5 [16];
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  undefined4 in_EAX;
  int iVar12;
  ImGuiContext *pIVar13;
  ImGuiIO *pIVar14;
  long lVar15;
  GL3WglProc *pp_Var16;
  long lVar17;
  GL3WglProc *pp_Var18;
  uint *puVar19;
  long lVar20;
  ulong uVar21;
  undefined8 uVar22;
  long lVar23;
  bool bVar24;
  float fVar25;
  float fVar27;
  undefined1 auVar26 [16];
  float fVar28;
  float fVar29;
  int iVar30;
  int iVar31;
  GLuint vertex_array_object;
  GLuint last_sampler;
  GLuint last_program;
  GLenum last_blend_equation_alpha;
  GLenum last_blend_equation_rgb;
  GLenum last_blend_dst_alpha;
  GLenum last_blend_src_alpha;
  GLenum last_blend_dst_rgb;
  GLenum last_blend_src_rgb;
  GLint last_polygon_mode [2];
  GLuint last_vertex_array_object;
  GLuint last_array_buffer;
  GLuint last_texture;
  GLenum last_active_texture;
  GLint last_scissor_box [4];
  GLint last_viewport [4];
  GLuint local_d4;
  uint local_d0;
  uint local_cc;
  float local_c8;
  int local_c4;
  uint local_c0;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  ImVec2 local_58;
  undefined8 uStack_50;
  ImVec2 local_48;
  undefined8 uStack_40;
  
  iVar30 = (int)((draw_data->FramebufferScale).x * (draw_data->DisplaySize).x);
  iVar31 = (int)((draw_data->FramebufferScale).y * (draw_data->DisplaySize).y);
  auVar26._0_4_ = -(uint)(0 < iVar30);
  auVar26._4_4_ = -(uint)(0 < iVar30);
  auVar26._8_4_ = -(uint)(0 < iVar31);
  auVar26._12_4_ = -(uint)(0 < iVar31);
  iVar12 = movmskpd(in_EAX,auVar26);
  if (iVar12 == 3) {
    local_88 = CONCAT44(iVar31,iVar30);
    uStack_80 = 0;
    pIVar13 = ImGui::GetCurrentContext();
    if (pIVar13 == (ImGuiContext *)0x0) {
      puVar19 = (uint *)0x0;
    }
    else {
      pIVar14 = ImGui::GetIO();
      puVar19 = (uint *)pIVar14->BackendRendererUserData;
    }
    (*imgl3wProcs.ptr[0x22])(0x84e0,&local_94);
    (*imgl3wProcs.ptr[0])(0x84c0);
    (*imgl3wProcs.ptr[0x22])(0x8b8d,&local_cc);
    (*imgl3wProcs.ptr[0x22])(0x8069,&local_98);
    if ((*puVar19 < 0x14a) && (*(char *)((long)puVar19 + 0x25) != '\x01')) {
      local_d0 = 0;
    }
    else {
      (*imgl3wProcs.ptr[0x22])(0x8919,&local_d0);
    }
    (*imgl3wProcs.ptr[0x22])(0x8894,&local_9c);
    (*imgl3wProcs.ptr[0x22])(0x85b5,&local_a0);
    if ((char)puVar19[0x18] == '\x01') {
      (*imgl3wProcs.ptr[0x22])(0xb40,&local_a8);
    }
    (*imgl3wProcs.ptr[0x22])(0xba2,&local_68);
    (*imgl3wProcs.ptr[0x22])(0xc10,&local_78);
    (*imgl3wProcs.ptr[0x22])(0x80c9,&local_ac);
    (*imgl3wProcs.ptr[0x22])(0x80c8,&local_b0);
    (*imgl3wProcs.ptr[0x22])(0x80cb,&local_b4);
    (*imgl3wProcs.ptr[0x22])(0x80ca,&local_b8);
    (*imgl3wProcs.ptr[0x22])(0x8009,&local_bc);
    (*imgl3wProcs.ptr[0x22])(0x883d,&local_c0);
    cVar6 = (*imgl3wProcs.ptr[0x2c])(0xbe2);
    cVar7 = (*imgl3wProcs.ptr[0x2c])(0xb44);
    cVar8 = (*imgl3wProcs.ptr[0x2c])(0xb71);
    cVar9 = (*imgl3wProcs.ptr[0x2c])(0xb90);
    cVar10 = (*imgl3wProcs.ptr[0x2c])(0xc11);
    bVar24 = true;
    if (0x135 < *puVar19) {
      cVar11 = (*imgl3wProcs.ptr[0x2c])(0x8f9d);
      bVar24 = cVar11 == '\0';
    }
    local_d4 = 0;
    (*imgl3wProcs.ptr[0x1f])(1,&local_d4);
    iVar12 = (int)local_88;
    local_c4 = (int)local_88;
    local_88 = CONCAT44(local_88._4_4_,local_88._4_4_);
    ImGui_ImplOpenGL3_SetupRenderState(draw_data,iVar12,local_88._4_4_,local_d4);
    if (0 < draw_data->CmdListsCount) {
      local_48 = draw_data->DisplayPos;
      uStack_40 = 0;
      local_58 = draw_data->FramebufferScale;
      uStack_50 = 0;
      local_c8 = (float)(int)local_88;
      lVar17 = 0;
      local_90 = puVar19;
      do {
        puVar19 = local_90;
        pIVar2 = (draw_data->CmdLists).Data[lVar17];
        lVar15 = (long)(pIVar2->VtxBuffer).Size;
        lVar20 = lVar15 * 0x14;
        lVar23 = (long)(pIVar2->IdxBuffer).Size * 4;
        if (*(char *)((long)local_90 + 0x62) == '\x01') {
          if (SBORROW8(*(long *)(local_90 + 0x14),lVar20) !=
              *(long *)(local_90 + 0x14) + lVar15 * -0x14 < 0) {
            *(long *)(local_90 + 0x14) = lVar20;
            (*imgl3wProcs.ptr[9])(0x8892,lVar20,0,0x88e0);
          }
          if (*(long *)(puVar19 + 0x16) < lVar23) {
            *(long *)(puVar19 + 0x16) = lVar23;
            (*imgl3wProcs.ptr[9])(0x8893,lVar23,0,0x88e0);
          }
          (*imgl3wProcs.ptr[10])(0x8892,0,lVar20,(pIVar2->VtxBuffer).Data);
          (*imgl3wProcs.ptr[10])(0x8893,0,lVar23,(pIVar2->IdxBuffer).Data);
        }
        else {
          (*imgl3wProcs.ptr[9])(0x8892,lVar20,(pIVar2->VtxBuffer).Data,0x88e0);
          (*imgl3wProcs.ptr[9])(0x8893,lVar23,(pIVar2->IdxBuffer).Data,0x88e0);
        }
        if (0 < (pIVar2->CmdBuffer).Size) {
          lVar15 = 0;
          lVar20 = 0;
          do {
            pIVar3 = (pIVar2->CmdBuffer).Data;
            pcVar4 = *(code **)((long)&pIVar3->UserCallback + lVar15);
            if (pcVar4 == (code *)0x0) {
              uVar22 = *(undefined8 *)((long)&(pIVar3->ClipRect).x + lVar15);
              uVar1 = *(undefined8 *)((long)&(pIVar3->ClipRect).z + lVar15);
              fVar28 = ((float)uVar22 - local_48.x) * local_58.x;
              fVar29 = ((float)((ulong)uVar22 >> 0x20) - local_48.y) * local_58.y;
              fVar25 = ((float)uVar1 - local_48.x) * local_58.x;
              fVar27 = ((float)((ulong)uVar1 >> 0x20) - local_48.y) * local_58.y;
              iVar12 = -(uint)(fVar28 < fVar25);
              iVar30 = -(uint)(fVar29 < fVar27);
              auVar5._4_4_ = iVar12;
              auVar5._0_4_ = iVar12;
              auVar5._8_4_ = iVar30;
              auVar5._12_4_ = iVar30;
              iVar12 = movmskpd(0,auVar5);
              if (iVar12 == 3) {
                (*imgl3wProcs.ptr[0x32])
                          ((ulong)(uint)(int)fVar28,(ulong)(uint)(int)(local_c8 - fVar27),
                           (ulong)(uint)(int)(fVar25 - fVar28),(ulong)(uint)(int)(fVar27 - fVar29));
                (*imgl3wProcs.ptr[4])(0xde1,(ulong)*(uint *)((long)&pIVar3->TextureId + lVar15));
                uVar21 = (ulong)*(uint *)((long)&pIVar3->ElemCount + lVar15);
                lVar23 = (ulong)*(uint *)((long)&pIVar3->IdxOffset + lVar15) << 2;
                if (*local_90 < 0x140) {
                  (*imgl3wProcs.ptr[0x18])(4,uVar21,0x1405,lVar23);
                }
                else {
                  (*imgl3wProcs.ptr[0x19])
                            (4,uVar21,0x1405,lVar23,
                             (ulong)*(uint *)((long)&pIVar3->VtxOffset + lVar15));
                }
              }
            }
            else if (pcVar4 == (code *)0xfffffffffffffff8) {
              ImGui_ImplOpenGL3_SetupRenderState(draw_data,local_c4,(int)local_88,local_d4);
            }
            else {
              (*pcVar4)(pIVar2);
            }
            lVar20 = lVar20 + 1;
            lVar15 = lVar15 + 0x38;
          } while (lVar20 < (pIVar2->CmdBuffer).Size);
        }
        lVar17 = lVar17 + 1;
        puVar19 = local_90;
      } while (lVar17 < draw_data->CmdListsCount);
    }
    (*imgl3wProcs.ptr[0x14])(1,&local_d4);
    if ((local_cc == 0) || (cVar11 = (*imgl3wProcs.ptr[0x2d])(), cVar11 != '\0')) {
      (*imgl3wProcs.ptr[0x38])((ulong)local_cc);
    }
    (*imgl3wProcs.ptr[4])(0xde1,(ulong)local_98);
    if ((0x149 < *puVar19) || (*(char *)((long)puVar19 + 0x25) == '\x01')) {
      (*imgl3wProcs.ptr[3])(0,(ulong)local_d0);
    }
    (*imgl3wProcs.ptr[0])((ulong)local_94);
    (*imgl3wProcs.ptr[5])((ulong)local_a0);
    (*imgl3wProcs.ptr[2])(0x8892,(ulong)local_9c);
    (*imgl3wProcs.ptr[7])((ulong)local_bc,(ulong)local_c0);
    (*imgl3wProcs.ptr[8])((ulong)local_ac,(ulong)local_b0,(ulong)local_b4,(ulong)local_b8);
    pp_Var18 = imgl3wProcs.ptr + 0x1a;
    pp_Var16 = imgl3wProcs.ptr + 0x1a;
    if (cVar6 == '\0') {
      pp_Var16 = imgl3wProcs.ptr + 0x16;
    }
    (**pp_Var16)(0xbe2);
    pp_Var16 = imgl3wProcs.ptr + 0x1a;
    if (cVar7 == '\0') {
      pp_Var16 = imgl3wProcs.ptr + 0x16;
    }
    (**pp_Var16)(0xb44);
    pp_Var16 = imgl3wProcs.ptr + 0x1a;
    if (cVar8 == '\0') {
      pp_Var16 = imgl3wProcs.ptr + 0x16;
    }
    (**pp_Var16)(0xb71);
    pp_Var16 = imgl3wProcs.ptr + 0x1a;
    if (cVar9 == '\0') {
      pp_Var16 = imgl3wProcs.ptr + 0x16;
    }
    (**pp_Var16)(0xb90);
    if (cVar10 == '\0') {
      pp_Var18 = imgl3wProcs.ptr + 0x16;
    }
    (**pp_Var18)(0xc11);
    if (0x135 < *puVar19) {
      (**(code **)((long)&imgl3wProcs + (ulong)(bVar24 ^ 1) * 0x20 + 0xb0))(0x8f9d);
    }
    if ((char)puVar19[0x18] == '\x01') {
      if ((*puVar19 < 0x137) || (*(char *)((long)puVar19 + 0x26) == '\x01')) {
        (*imgl3wProcs.ptr[0x30])(0x404,(ulong)local_a8);
        uVar22 = 0x405;
      }
      else {
        uVar22 = 0x408;
        local_a4 = local_a8;
      }
      (*imgl3wProcs.ptr[0x30])(uVar22,(ulong)local_a4);
    }
    (*imgl3wProcs.ptr[0x3a])((ulong)local_68,(ulong)local_64,(ulong)local_60,(ulong)local_5c);
    (*imgl3wProcs.ptr[0x32])((ulong)local_78,(ulong)local_74,(ulong)local_70,(ulong)local_6c);
    return;
  }
  return;
}

Assistant:

void    ImGui_ImplOpenGL3_RenderDrawData(ImDrawData* draw_data)
{
    // Avoid rendering when minimized, scale coordinates for retina displays (screen coordinates != framebuffer coordinates)
    int fb_width = (int)(draw_data->DisplaySize.x * draw_data->FramebufferScale.x);
    int fb_height = (int)(draw_data->DisplaySize.y * draw_data->FramebufferScale.y);
    if (fb_width <= 0 || fb_height <= 0)
        return;

    ImGui_ImplOpenGL3_Data* bd = ImGui_ImplOpenGL3_GetBackendData();

    // Backup GL state
    GLenum last_active_texture; glGetIntegerv(GL_ACTIVE_TEXTURE, (GLint*)&last_active_texture);
    glActiveTexture(GL_TEXTURE0);
    GLuint last_program; glGetIntegerv(GL_CURRENT_PROGRAM, (GLint*)&last_program);
    GLuint last_texture; glGetIntegerv(GL_TEXTURE_BINDING_2D, (GLint*)&last_texture);
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_BIND_SAMPLER
    GLuint last_sampler; if (bd->GlVersion >= 330 || bd->GlProfileIsES3) { glGetIntegerv(GL_SAMPLER_BINDING, (GLint*)&last_sampler); } else { last_sampler = 0; }
#endif
    GLuint last_array_buffer; glGetIntegerv(GL_ARRAY_BUFFER_BINDING, (GLint*)&last_array_buffer);
#ifndef IMGUI_IMPL_OPENGL_USE_VERTEX_ARRAY
    // This is part of VAO on OpenGL 3.0+ and OpenGL ES 3.0+.
    GLint last_element_array_buffer; glGetIntegerv(GL_ELEMENT_ARRAY_BUFFER_BINDING, &last_element_array_buffer);
    ImGui_ImplOpenGL3_VtxAttribState last_vtx_attrib_state_pos; last_vtx_attrib_state_pos.GetState(bd->AttribLocationVtxPos);
    ImGui_ImplOpenGL3_VtxAttribState last_vtx_attrib_state_uv; last_vtx_attrib_state_uv.GetState(bd->AttribLocationVtxUV);
    ImGui_ImplOpenGL3_VtxAttribState last_vtx_attrib_state_color; last_vtx_attrib_state_color.GetState(bd->AttribLocationVtxColor);
#endif
#ifdef IMGUI_IMPL_OPENGL_USE_VERTEX_ARRAY
    GLuint last_vertex_array_object; glGetIntegerv(GL_VERTEX_ARRAY_BINDING, (GLint*)&last_vertex_array_object);
#endif
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_POLYGON_MODE
    GLint last_polygon_mode[2]; if (bd->HasPolygonMode) { glGetIntegerv(GL_POLYGON_MODE, last_polygon_mode); }
#endif
    GLint last_viewport[4]; glGetIntegerv(GL_VIEWPORT, last_viewport);
    GLint last_scissor_box[4]; glGetIntegerv(GL_SCISSOR_BOX, last_scissor_box);
    GLenum last_blend_src_rgb; glGetIntegerv(GL_BLEND_SRC_RGB, (GLint*)&last_blend_src_rgb);
    GLenum last_blend_dst_rgb; glGetIntegerv(GL_BLEND_DST_RGB, (GLint*)&last_blend_dst_rgb);
    GLenum last_blend_src_alpha; glGetIntegerv(GL_BLEND_SRC_ALPHA, (GLint*)&last_blend_src_alpha);
    GLenum last_blend_dst_alpha; glGetIntegerv(GL_BLEND_DST_ALPHA, (GLint*)&last_blend_dst_alpha);
    GLenum last_blend_equation_rgb; glGetIntegerv(GL_BLEND_EQUATION_RGB, (GLint*)&last_blend_equation_rgb);
    GLenum last_blend_equation_alpha; glGetIntegerv(GL_BLEND_EQUATION_ALPHA, (GLint*)&last_blend_equation_alpha);
    GLboolean last_enable_blend = glIsEnabled(GL_BLEND);
    GLboolean last_enable_cull_face = glIsEnabled(GL_CULL_FACE);
    GLboolean last_enable_depth_test = glIsEnabled(GL_DEPTH_TEST);
    GLboolean last_enable_stencil_test = glIsEnabled(GL_STENCIL_TEST);
    GLboolean last_enable_scissor_test = glIsEnabled(GL_SCISSOR_TEST);
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_PRIMITIVE_RESTART
    GLboolean last_enable_primitive_restart = (bd->GlVersion >= 310) ? glIsEnabled(GL_PRIMITIVE_RESTART) : GL_FALSE;
#endif

    // Setup desired GL state
    // Recreate the VAO every time (this is to easily allow multiple GL contexts to be rendered to. VAO are not shared among GL contexts)
    // The renderer would actually work without any VAO bound, but then our VertexAttrib calls would overwrite the default one currently bound.
    GLuint vertex_array_object = 0;
#ifdef IMGUI_IMPL_OPENGL_USE_VERTEX_ARRAY
    GL_CALL(glGenVertexArrays(1, &vertex_array_object));
#endif
    ImGui_ImplOpenGL3_SetupRenderState(draw_data, fb_width, fb_height, vertex_array_object);

    // Will project scissor/clipping rectangles into framebuffer space
    ImVec2 clip_off = draw_data->DisplayPos;         // (0,0) unless using multi-viewports
    ImVec2 clip_scale = draw_data->FramebufferScale; // (1,1) unless using retina display which are often (2,2)

    // Render command lists
    for (int n = 0; n < draw_data->CmdListsCount; n++)
    {
        const ImDrawList* cmd_list = draw_data->CmdLists[n];

        // Upload vertex/index buffers
        // - OpenGL drivers are in a very sorry state nowadays....
        //   During 2021 we attempted to switch from glBufferData() to orphaning+glBufferSubData() following reports
        //   of leaks on Intel GPU when using multi-viewports on Windows.
        // - After this we kept hearing of various display corruptions issues. We started disabling on non-Intel GPU, but issues still got reported on Intel.
        // - We are now back to using exclusively glBufferData(). So bd->UseBufferSubData IS ALWAYS FALSE in this code.
        //   We are keeping the old code path for a while in case people finding new issues may want to test the bd->UseBufferSubData path.
        // - See https://github.com/ocornut/imgui/issues/4468 and please report any corruption issues.
        const GLsizeiptr vtx_buffer_size = (GLsizeiptr)cmd_list->VtxBuffer.Size * (int)sizeof(ImDrawVert);
        const GLsizeiptr idx_buffer_size = (GLsizeiptr)cmd_list->IdxBuffer.Size * (int)sizeof(ImDrawIdx);
        if (bd->UseBufferSubData)
        {
            if (bd->VertexBufferSize < vtx_buffer_size)
            {
                bd->VertexBufferSize = vtx_buffer_size;
                GL_CALL(glBufferData(GL_ARRAY_BUFFER, bd->VertexBufferSize, nullptr, GL_STREAM_DRAW));
            }
            if (bd->IndexBufferSize < idx_buffer_size)
            {
                bd->IndexBufferSize = idx_buffer_size;
                GL_CALL(glBufferData(GL_ELEMENT_ARRAY_BUFFER, bd->IndexBufferSize, nullptr, GL_STREAM_DRAW));
            }
            GL_CALL(glBufferSubData(GL_ARRAY_BUFFER, 0, vtx_buffer_size, (const GLvoid*)cmd_list->VtxBuffer.Data));
            GL_CALL(glBufferSubData(GL_ELEMENT_ARRAY_BUFFER, 0, idx_buffer_size, (const GLvoid*)cmd_list->IdxBuffer.Data));
        }
        else
        {
            GL_CALL(glBufferData(GL_ARRAY_BUFFER, vtx_buffer_size, (const GLvoid*)cmd_list->VtxBuffer.Data, GL_STREAM_DRAW));
            GL_CALL(glBufferData(GL_ELEMENT_ARRAY_BUFFER, idx_buffer_size, (const GLvoid*)cmd_list->IdxBuffer.Data, GL_STREAM_DRAW));
        }

        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            const ImDrawCmd* pcmd = &cmd_list->CmdBuffer[cmd_i];
            if (pcmd->UserCallback != nullptr)
            {
                // User callback, registered via ImDrawList::AddCallback()
                // (ImDrawCallback_ResetRenderState is a special callback value used by the user to request the renderer to reset render state.)
                if (pcmd->UserCallback == ImDrawCallback_ResetRenderState)
                    ImGui_ImplOpenGL3_SetupRenderState(draw_data, fb_width, fb_height, vertex_array_object);
                else
                    pcmd->UserCallback(cmd_list, pcmd);
            }
            else
            {
                // Project scissor/clipping rectangles into framebuffer space
                ImVec2 clip_min((pcmd->ClipRect.x - clip_off.x) * clip_scale.x, (pcmd->ClipRect.y - clip_off.y) * clip_scale.y);
                ImVec2 clip_max((pcmd->ClipRect.z - clip_off.x) * clip_scale.x, (pcmd->ClipRect.w - clip_off.y) * clip_scale.y);
                if (clip_max.x <= clip_min.x || clip_max.y <= clip_min.y)
                    continue;

                // Apply scissor/clipping rectangle (Y is inverted in OpenGL)
                GL_CALL(glScissor((int)clip_min.x, (int)((float)fb_height - clip_max.y), (int)(clip_max.x - clip_min.x), (int)(clip_max.y - clip_min.y)));

                // Bind texture, Draw
                GL_CALL(glBindTexture(GL_TEXTURE_2D, (GLuint)(intptr_t)pcmd->GetTexID()));
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_VTX_OFFSET
                if (bd->GlVersion >= 320)
                    GL_CALL(glDrawElementsBaseVertex(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, (void*)(intptr_t)(pcmd->IdxOffset * sizeof(ImDrawIdx)), (GLint)pcmd->VtxOffset));
                else
#endif
                GL_CALL(glDrawElements(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, (void*)(intptr_t)(pcmd->IdxOffset * sizeof(ImDrawIdx))));
            }
        }
    }

    // Destroy the temporary VAO
#ifdef IMGUI_IMPL_OPENGL_USE_VERTEX_ARRAY
    GL_CALL(glDeleteVertexArrays(1, &vertex_array_object));
#endif

    // Restore modified GL state
    // This "glIsProgram()" check is required because if the program is "pending deletion" at the time of binding backup, it will have been deleted by now and will cause an OpenGL error. See #6220.
    if (last_program == 0 || glIsProgram(last_program)) glUseProgram(last_program);
    glBindTexture(GL_TEXTURE_2D, last_texture);
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_BIND_SAMPLER
    if (bd->GlVersion >= 330 || bd->GlProfileIsES3)
        glBindSampler(0, last_sampler);
#endif
    glActiveTexture(last_active_texture);
#ifdef IMGUI_IMPL_OPENGL_USE_VERTEX_ARRAY
    glBindVertexArray(last_vertex_array_object);
#endif
    glBindBuffer(GL_ARRAY_BUFFER, last_array_buffer);
#ifndef IMGUI_IMPL_OPENGL_USE_VERTEX_ARRAY
    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, last_element_array_buffer);
    last_vtx_attrib_state_pos.SetState(bd->AttribLocationVtxPos);
    last_vtx_attrib_state_uv.SetState(bd->AttribLocationVtxUV);
    last_vtx_attrib_state_color.SetState(bd->AttribLocationVtxColor);
#endif
    glBlendEquationSeparate(last_blend_equation_rgb, last_blend_equation_alpha);
    glBlendFuncSeparate(last_blend_src_rgb, last_blend_dst_rgb, last_blend_src_alpha, last_blend_dst_alpha);
    if (last_enable_blend) glEnable(GL_BLEND); else glDisable(GL_BLEND);
    if (last_enable_cull_face) glEnable(GL_CULL_FACE); else glDisable(GL_CULL_FACE);
    if (last_enable_depth_test) glEnable(GL_DEPTH_TEST); else glDisable(GL_DEPTH_TEST);
    if (last_enable_stencil_test) glEnable(GL_STENCIL_TEST); else glDisable(GL_STENCIL_TEST);
    if (last_enable_scissor_test) glEnable(GL_SCISSOR_TEST); else glDisable(GL_SCISSOR_TEST);
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_PRIMITIVE_RESTART
    if (bd->GlVersion >= 310) { if (last_enable_primitive_restart) glEnable(GL_PRIMITIVE_RESTART); else glDisable(GL_PRIMITIVE_RESTART); }
#endif

#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_POLYGON_MODE
    // Desktop OpenGL 3.0 and OpenGL 3.1 had separate polygon draw modes for front-facing and back-facing faces of polygons
    if (bd->HasPolygonMode) { if (bd->GlVersion <= 310 || bd->GlProfileIsCompat) { glPolygonMode(GL_FRONT, (GLenum)last_polygon_mode[0]); glPolygonMode(GL_BACK, (GLenum)last_polygon_mode[1]); } else { glPolygonMode(GL_FRONT_AND_BACK, (GLenum)last_polygon_mode[0]); } }
#endif // IMGUI_IMPL_OPENGL_MAY_HAVE_POLYGON_MODE

    glViewport(last_viewport[0], last_viewport[1], (GLsizei)last_viewport[2], (GLsizei)last_viewport[3]);
    glScissor(last_scissor_box[0], last_scissor_box[1], (GLsizei)last_scissor_box[2], (GLsizei)last_scissor_box[3]);
    (void)bd; // Not all compilation paths use this
}